

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.cpp
# Opt level: O0

Image * Png_Operation::Load(string *path)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  ulong uVar7;
  char *__filename;
  undefined8 uVar8;
  void *__ptr;
  size_t __size;
  void *pvVar9;
  uchar *puVar10;
  uchar *puVar11;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t y_2;
  uint32_t x;
  uint8_t *outX;
  uint8_t *column;
  uint32_t y_1;
  uint8_t *outY;
  uint32_t y;
  size_t rowByteCount;
  uint8_t **row_pointers;
  uint8_t bitDepth;
  uint8_t colorType;
  uint32_t height;
  uint32_t width;
  png_infop info;
  png_structp png;
  FILE *file;
  Image *image;
  undefined8 in_stack_ffffffffffffff50;
  undefined2 uVar12;
  undefined8 in_stack_ffffffffffffff58;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar13;
  imageException *in_stack_ffffffffffffff80;
  uchar *local_78;
  uint local_6c;
  uchar *local_68;
  uint local_5c;
  long local_38;
  long local_30;
  FILE *local_28;
  
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    uVar8 = __cxa_allocate_exception(0x28);
    imageException::imageException
              (in_stack_ffffffffffffff80,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    __cxa_throw(uVar8,&imageException::typeinfo,imageException::~imageException);
  }
  __filename = (char *)std::__cxx11::string::data();
  local_28 = fopen(__filename,"rb");
  if (local_28 != (FILE *)0x0) {
    local_30 = png_create_read_struct("1.6.37",0,0);
    if (local_30 == 0) {
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                (in_stack_ffffffffffffff60,(uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                 (uint32_t)in_stack_ffffffffffffff58,
                 (uint8_t)((ulong)in_stack_ffffffffffffff50 >> 0x38),
                 (uint8_t)((ulong)in_stack_ffffffffffffff50 >> 0x30));
    }
    else {
      local_38 = png_create_info_struct(local_30);
      if (local_38 == 0) {
        PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                  (in_stack_ffffffffffffff60,(uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (uint32_t)in_stack_ffffffffffffff58,
                   (uint8_t)((ulong)in_stack_ffffffffffffff50 >> 0x38),
                   (uint8_t)((ulong)in_stack_ffffffffffffff50 >> 0x30));
      }
      else {
        png_init_io(local_30,local_28);
        png_read_info(local_30,local_38);
        uVar3 = png_get_image_width(local_30,local_38);
        uVar4 = png_get_image_height(local_30,local_38);
        cVar1 = png_get_color_type(local_30,local_38);
        bVar2 = png_get_bit_depth(local_30,local_38);
        if (bVar2 == 0x10) {
          png_set_strip_16(local_30);
        }
        if (cVar1 == '\x03') {
          png_set_palette_to_rgb(local_30);
        }
        if ((cVar1 == '\0') && (bVar2 < 8)) {
          png_set_expand_gray_1_2_4_to_8(local_30);
        }
        iVar5 = png_get_valid(local_30,local_38,0x10);
        if (iVar5 != 0) {
          png_set_tRNS_to_alpha(local_30);
        }
        if (((cVar1 == '\x02') || (cVar1 == '\0')) || (cVar1 == '\x03')) {
          png_set_filler(local_30,0xff,1);
        }
        if ((cVar1 == '\0') || (cVar1 == '\x04')) {
          png_set_gray_to_rgb(local_30);
        }
        png_read_update_info(local_30,local_38);
        __ptr = malloc((ulong)uVar4 << 3);
        __size = png_get_rowbytes(local_30,local_38);
        for (local_5c = 0; uVar12 = (undefined2)((ulong)in_stack_ffffffffffffff50 >> 0x30),
            local_5c < uVar4; local_5c = local_5c + 1) {
          pvVar9 = malloc(__size);
          *(void **)((long)__ptr + (ulong)local_5c * 8) = pvVar9;
        }
        png_read_image(local_30,__ptr);
        PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                  (in_stack_ffffffffffffff60,(uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (uint32_t)in_stack_ffffffffffffff58,(uint8_t)((ushort)uVar12 >> 8),
                   (uint8_t)uVar12);
        local_68 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
        local_6c = 0;
        while (local_6c < uVar4) {
          local_78 = *(uchar **)((long)__ptr + (ulong)local_6c * 8);
          puVar11 = local_68;
          for (uVar13 = 0; uVar13 < uVar3; uVar13 = uVar13 + 1) {
            *puVar11 = local_78[2];
            puVar10 = puVar11 + 2;
            puVar11[1] = local_78[1];
            puVar11 = puVar11 + 3;
            *puVar10 = *local_78;
            local_78 = local_78 + 4;
          }
          local_6c = local_6c + 1;
          uVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
          local_68 = local_68 + uVar6;
        }
        fclose(local_28);
        for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
          free(*(void **)((long)__ptr + (ulong)uVar3 * 8));
        }
        free(__ptr);
        png_destroy_read_struct(&local_30,&local_38,0);
      }
    }
    return in_RDI;
  }
  uVar8 = __cxa_allocate_exception(0x28);
  imageException::imageException
            (in_stack_ffffffffffffff80,
             (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  __cxa_throw(uVar8,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

PenguinV_Image::Image Load( const std::string & path )
    {
        if( path.empty() )
            throw imageException( "Incorrect file path for image file loading" );

        FILE * file = fopen( path.data(), "rb" );
        if( !file )
            throw imageException( "Cannot create file for reading" );

        png_structp png = png_create_read_struct( PNG_LIBPNG_VER_STRING, NULL, NULL, NULL );
        if( !png )
            return PenguinV_Image::Image();

        png_infop info = png_create_info_struct( png );
        if( !info )
            return PenguinV_Image::Image();

        png_init_io( png, file );
        png_read_info( png, info );

        const uint32_t width    = static_cast<uint32_t>( png_get_image_width ( png, info ) );
        const uint32_t height   = static_cast<uint32_t>( png_get_image_height( png, info ) );
        const uint8_t colorType = png_get_color_type  ( png, info );
        const uint8_t bitDepth  = png_get_bit_depth   ( png, info );

        if( bitDepth == 16u )
            png_set_strip_16( png );

        if( colorType == PNG_COLOR_TYPE_PALETTE )
            png_set_palette_to_rgb( png );

        // PNG_COLOR_TYPE_GRAY_ALPHA is always 8 or 16bit depth
        if( colorType == PNG_COLOR_TYPE_GRAY && bitDepth < 8u )
            png_set_expand_gray_1_2_4_to_8( png );

        if( png_get_valid( png, info, PNG_INFO_tRNS ) )
            png_set_tRNS_to_alpha( png );

        // These color_type don't have an alpha channel then fill it with 0xff
        if( colorType == PNG_COLOR_TYPE_RGB || colorType == PNG_COLOR_TYPE_GRAY || colorType == PNG_COLOR_TYPE_PALETTE )
            png_set_filler( png, 0xFF, PNG_FILLER_AFTER );

        if( colorType == PNG_COLOR_TYPE_GRAY || colorType == PNG_COLOR_TYPE_GRAY_ALPHA )
            png_set_gray_to_rgb( png );

        png_read_update_info( png, info );

        uint8_t ** row_pointers = reinterpret_cast<uint8_t**>( malloc( sizeof( uint8_t* ) * height ) );

        const size_t rowByteCount = png_get_rowbytes( png, info );

        for( uint32_t y = 0; y < height; ++y )
            row_pointers[y] = reinterpret_cast<uint8_t*>( malloc( rowByteCount ) );

        png_read_image( png, row_pointers );

        PenguinV_Image::Image image( width, height, PenguinV_Image::RGB );

        uint8_t * outY = image.data();
        for( uint32_t y = 0; y < height; ++y, outY += image.rowSize() ) {
            const uint8_t * column = row_pointers[y];
            uint8_t * outX = outY;
            for( uint32_t x = 0; x < width; ++x, column += 4 ) {
                *(outX++) = column[2];
                *(outX++) = column[1];
                *(outX++) = column[0];
            }
        }

        fclose( file );

        for( uint32_t y = 0; y < height; ++y )
            free( row_pointers[y] );
        free( row_pointers );

        png_destroy_read_struct( &png, &info, NULL );

        return image;
    }